

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  long lVar5;
  int index;
  int iVar6;
  StyledStreamWriter *this_00;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  
  AVar2 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar2 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  iVar6 = 0;
  do {
    if (((int)AVar2 <= iVar6) || (bVar1)) {
      bVar8 = true;
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(long)(int)AVar2);
        this->field_0x68 = this->field_0x68 | 1;
        iVar6 = AVar2 * 2 + 2;
        uVar9 = 0;
        uVar10 = (ulong)AVar2;
        if ((int)AVar2 < 1) {
          uVar10 = uVar9;
        }
        lVar5 = 8;
        bVar7 = 0;
        for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          this_00 = (StyledStreamWriter *)value;
          pVVar4 = Value::operator[](value,(int)uVar9);
          bVar1 = hasCommentForValue(this_00,pVVar4);
          bVar7 = bVar7 | bVar1;
          pVVar4 = Value::operator[](value,(int)uVar9);
          writeValue(this,pVVar4);
          iVar6 = iVar6 + *(int *)((long)&(((this->childValues_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar5);
          lVar5 = lVar5 + 0x20;
        }
        this->field_0x68 = this->field_0x68 & 0xfe;
        bVar8 = (bool)(bVar7 | this->rightMargin_ <= iVar6);
      }
      return bVar8;
    }
    pVVar4 = Value::operator[](value,iVar6);
    bVar1 = Value::isArray(pVVar4);
    if (bVar1) {
LAB_00122ae5:
      AVar3 = Value::size(pVVar4);
      bVar1 = AVar3 != 0;
    }
    else {
      bVar1 = Value::isObject(pVVar4);
      if (bVar1) goto LAB_00122ae5;
      bVar1 = false;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}